

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::obtain_storage(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                 *this,undefined8 *a,long n,size_t max_align)

{
  long lVar1;
  clone_func_ptr_t pcVar2;
  void_pointer pvVar3;
  unsigned_long uVar4;
  void *pvVar5;
  Interface *pIVar6;
  elem_ptr_pointer pvVar7;
  elem_ptr_pointer __s;
  elem_ptr_pointer pvVar8;
  elem_ptr_pointer pvVar9;
  allocator<Interface> local_49;
  size_t local_48;
  elem_ptr_pointer local_40;
  undefined8 *local_38;
  
  this->_align_max = max_align;
  __s = (elem_ptr_pointer)*a;
  pvVar8 = (elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  pvVar9 = this->_free_elem;
  local_48 = max_align;
  local_38 = a;
  if (n != 0) {
    memset(__s,0,((n * 0x28 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  pvVar7 = __s + n;
  local_40 = pvVar7;
  if (pvVar8 != pvVar9) {
    lVar1 = local_48 - 1;
    do {
      pcVar2 = (pvVar8->
               super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
               ).
               super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
               .cf;
      (__s->
      super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
      ).
      super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
      .cf = pcVar2;
      pIVar6 = (pvVar8->ptr).second;
      (__s->ptr).second = pIVar6;
      uVar4 = (pvVar8->sf).second;
      (__s->sf).first = (pvVar8->sf).first;
      (__s->sf).second = uVar4;
      pvVar5 = (void *)((lVar1 - (ulong)(lVar1 + (long)pvVar7) % local_48) + (long)pvVar7);
      (__s->ptr).first = pvVar5;
      pIVar6 = (*pcVar2)(&local_49,pIVar6,pvVar5,Move);
      (__s->ptr).second = pIVar6;
      pvVar7 = (elem_ptr_pointer)((long)(__s->ptr).first + (__s->sf).first);
      pvVar8 = pvVar8 + 1;
      __s = __s + 1;
    } while (pvVar8 != pvVar9);
  }
  pvVar9 = (elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  pvVar8 = this->_free_elem;
  if (pvVar8 != pvVar9) {
    do {
      (*((pvVar9->ptr).second)->_vptr_Interface[2])();
      (pvVar9->ptr).second = (Interface *)0x0;
      (pvVar9->sf).first = 0;
      (pvVar9->
      super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
      ).
      super_delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
      .cf = (clone_func_ptr_t)0x0;
      (pvVar9->ptr).first = (void *)0x0;
      (pvVar9->sf).second = 0;
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != pvVar8);
    pvVar9 = (elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage
    ;
  }
  this->_align_max = 8;
  pvVar8 = pvVar9;
  if (((ulong)((long)this->_begin_storage - (long)pvVar9) / 5 & 0xfffffffffffffff8) * 5 != 0) {
    do {
      (pvVar8->sf).first = 0;
      (pvVar8->sf).second = 0;
      (pvVar8->ptr).first = (void *)0x0;
      (pvVar8->ptr).second = (Interface *)0x0;
      pvVar8 = pvVar8 + 1;
      pvVar9 = (elem_ptr_pointer)
               (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
    } while (pvVar8 != pvVar9 + (ulong)((long)this->_begin_storage - (long)pvVar9) / 0x28);
  }
  this->_free_elem = (elem_ptr_pointer)0x0;
  this->_begin_storage = (void_pointer)0x0;
  operator_delete(pvVar9,(long)(this->super_allocator_base<std::allocator<unsigned_char>_>).
                               _end_storage - (long)pvVar9);
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage = (void_pointer)0x0;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage = (void_pointer)0x0;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage = (void_pointer)*local_38;
  *local_38 = 0;
  pvVar3 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage =
       (void_pointer)local_38[1];
  local_38[1] = pvVar3;
  this->_free_elem = __s;
  this->_begin_storage = local_40;
  this->_align_max = local_48;
  return;
}

Assistant:

inline void vector<I, A, C>::obtain_storage(
    my_base&& a, size_t n, size_t max_align, std::false_type /*unused*/) noexcept
{
    _align_max = max_align;
    auto ret   = poly_uninitialized_move(
        a, a.storage(), begin_elem(), end_elem(), std::next(begin_elem(), n), max_align);
    tidy();
    base().swap(a);
    set_ptrs(ret);
    _align_max = max_align;
}